

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy.hpp
# Opt level: O0

SphereTree *
sphere_hierarchy(SphereTree *__return_storage_ptr__,vector<Sphere,_std::allocator<Sphere>_> *spheres
                )

{
  bool bVar1;
  reference pSVar2;
  size_type sVar3;
  iterator __first;
  ulong uVar4;
  reference pvVar5;
  pointer pSVar6;
  reference pSVar7;
  Sphere SVar8;
  data_t local_288;
  data_t dStack_284;
  undefined1 local_240 [8];
  SphereTree p_2;
  iterator __end3_3;
  iterator __begin3_3;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range3_3;
  undefined1 local_1f8 [4];
  float curloss;
  Sphere local_1e0;
  reference local_1d0;
  SphereTree *p_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range3_2;
  __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_> local_188;
  undefined1 local_180 [8];
  SphereTree o;
  iterator __end3_1;
  iterator __begin3_1;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range3_1;
  SphereTree *p;
  iterator __end3;
  iterator __begin3;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range3;
  float lastloss;
  SphereTree local_100;
  int local_d4;
  undefined1 local_d0 [4];
  int i;
  vector<SphereTree,_std::allocator<SphereTree>_> parents;
  SphereTree local_80;
  undefined8 uStack_58;
  Sphere s;
  iterator __end1;
  iterator __begin1;
  vector<Sphere,_std::allocator<Sphere>_> *__range1;
  vector<SphereTree,_std::allocator<SphereTree>_> nodes;
  vector<Sphere,_std::allocator<Sphere>_> *spheres_local;
  
  nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)spheres;
  github111116::ConsoleLogger::log<char[29]>(&console,(char (*) [29])"building sphere hierarchy...")
  ;
  std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
            ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1);
  __end1 = std::vector<Sphere,_std::allocator<Sphere>_>::begin(spheres);
  s._8_8_ = std::vector<Sphere,_std::allocator<Sphere>_>::end(spheres);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                                     *)&s.center.z), bVar1) {
    pSVar2 = __gnu_cxx::__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator*(&__end1);
    uStack_58._0_4_ = (pSVar2->center).x;
    uStack_58._4_4_ = (pSVar2->center).y;
    s.center._0_8_ = *(undefined8 *)&(pSVar2->center).z;
    SphereTree::SphereTree(&local_80,*pSVar2);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::push_back
              ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1,&local_80);
    SphereTree::~SphereTree(&local_80);
    __gnu_cxx::__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
    operator++(&__end1);
  }
  while (sVar3 = std::vector<SphereTree,_std::allocator<SphereTree>_>::size
                           ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1), 1 < sVar3
        ) {
    __first = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                        ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1);
    parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                            ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>>
              ((__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )__first._M_current,
               (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
              ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
    for (local_d4 = 0; uVar4 = (ulong)local_d4,
        sVar3 = std::vector<SphereTree,_std::allocator<SphereTree>_>::size
                          ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1),
        uVar4 < (sVar3 - 1 >> 2) + 1; local_d4 = local_d4 + 1) {
      pvVar5 = std::vector<SphereTree,_std::allocator<SphereTree>_>::operator[]
                         ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1,
                          (long)local_d4);
      SphereTree::SphereTree(&local_100,pvVar5->bound);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::push_back
                ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0,&local_100);
      SphereTree::~SphereTree(&local_100);
    }
    __range3._4_4_ = 1e+18;
    while( true ) {
      __end3 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                         ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
      p = (SphereTree *)
          std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                    ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                         *)&p), bVar1) {
        pSVar7 = __gnu_cxx::
                 __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                 ::operator*(&__end3);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::clear(&pSVar7->child);
        __gnu_cxx::
        __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
        operator++(&__end3);
      }
      __end3_1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                           ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1);
      o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                              ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                 *)&o.child.
                                    super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
        pSVar7 = __gnu_cxx::
                 __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                 ::operator*(&__end3_1);
        SphereTree::SphereTree((SphereTree *)local_180,pSVar7);
        SphereTree::SphereTree((SphereTree *)&__range3_2,(SphereTree *)local_180);
        local_188._M_current =
             (SphereTree *)
             argmin<std::vector<SphereTree,std::allocator<SphereTree>>,sphere_hierarchy(std::vector<Sphere,std::allocator<Sphere>>)::__0>
                       ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0,
                        (anon_class_40_1_54a3980f *)&__range3_2);
        pSVar6 = __gnu_cxx::
                 __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                 ::operator->(&local_188);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::push_back
                  (&pSVar6->child,(value_type *)local_180);
        sphere_hierarchy(std::vector<Sphere,std::allocator<Sphere>>)::$_0::~__0((__0 *)&__range3_2);
        SphereTree::~SphereTree((SphereTree *)local_180);
        __gnu_cxx::
        __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
        operator++(&__end3_1);
      }
      __end3_2 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                           ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
      p_1 = (SphereTree *)
            std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                      ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                 *)&p_1), bVar1) {
        local_1d0 = __gnu_cxx::
                    __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                    ::operator*(&__end3_2);
        sphere_tree_leaves((vector<Sphere,_std::allocator<Sphere>_> *)local_1f8,local_1d0);
        SVar8 = sphere_set_bounding_sphere((vector<Sphere,_std::allocator<Sphere>_> *)local_1f8);
        local_1e0._8_8_ = SVar8._8_8_;
        local_288 = SVar8.center.x;
        dStack_284 = SVar8.center.y;
        local_1e0.center.x = local_288;
        local_1e0.center.y = dStack_284;
        Sphere::operator=(&local_1d0->bound,&local_1e0);
        std::vector<Sphere,_std::allocator<Sphere>_>::~vector
                  ((vector<Sphere,_std::allocator<Sphere>_> *)local_1f8);
        __gnu_cxx::
        __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
        operator++(&__end3_2);
      }
      __range3_3._4_4_ = 0.0;
      __end3_3 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                           ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
      p_2.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                              ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                 *)&p_2.child.
                                    super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
        pSVar7 = __gnu_cxx::
                 __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                 ::operator*(&__end3_3);
        SphereTree::SphereTree((SphereTree *)local_240,pSVar7);
        __range3_3._4_4_ = p_2.bound.center.y + __range3_3._4_4_;
        SphereTree::~SphereTree((SphereTree *)local_240);
        __gnu_cxx::
        __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
        operator++(&__end3_3);
      }
      if (__range3._4_4_ < __range3_3._4_4_) {
        github111116::ConsoleLogger::debug<char[35]>
                  (&console,(char (*) [35])"sphere clustering: loss increasing");
      }
      if (__range3._4_4_ - 1e-05 < __range3_3._4_4_) break;
      __range3._4_4_ = __range3_3._4_4_;
    }
    std::vector<SphereTree,_std::allocator<SphereTree>_>::operator=
              ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1,
               (vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector
              ((vector<SphereTree,_std::allocator<SphereTree>_> *)local_d0);
  }
  pvVar5 = std::vector<SphereTree,_std::allocator<SphereTree>_>::operator[]
                     ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1,0);
  SphereTree::SphereTree(__return_storage_ptr__,pvVar5);
  std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector
            ((vector<SphereTree,_std::allocator<SphereTree>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

SphereTree sphere_hierarchy(std::vector<Sphere> spheres)
{
	console.log("building sphere hierarchy...");
	// build leaf nodes
	std::vector<SphereTree> nodes;
	for (auto s: spheres)
		nodes.push_back(SphereTree(s));
	// successively form next layer
	while (nodes.size() > 1) {
		// randomly select representatives
		std::random_shuffle(nodes.begin(), nodes.end());
		std::vector<SphereTree> parents;
		for (int i=0; i<(nodes.size()-1)/4+1; ++i)
			parents.push_back(SphereTree(nodes[i].bound));
		// iteratively assign & optimize
		float lastloss = 1e18;
		while (true) {
			// stage 1. assign
			for (auto& p: parents)
				p.child.clear();
			for (auto o: nodes)
				argmin(parents, [o](const SphereTree& t){return norm(t.bound.center - o.bound.center);})->child.push_back(o);
			// state 2. optimize
			for (auto& p: parents)
				p.bound = sphere_set_bounding_sphere(sphere_tree_leaves(p));
			// calculate total loss
			float curloss = 0;
			for (auto p: parents)
				curloss += p.bound.radius;
			if (curloss > lastloss)
				console.debug("sphere clustering: loss increasing");
			if (curloss > lastloss - 1e-5)
				break;
			lastloss = curloss;
		}
		nodes = parents;
	}
	return nodes[0];
}